

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ImplicitAnsiPortSyntax::setChild
          (ImplicitAnsiPortSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  DeclaratorSyntax *pDVar4;
  
  pSVar3 = TokenOrSyntax::node(&child);
  if (index == 2) {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pDVar4 = (DeclaratorSyntax *)0x0;
    }
    else {
      pDVar4 = (DeclaratorSyntax *)TokenOrSyntax::node(&child);
    }
    (this->declarator).ptr = pDVar4;
  }
  else if (index == 1) {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pSVar3 = (SyntaxNode *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
    }
    (this->header).ptr = (PortHeaderSyntax *)pSVar3;
  }
  else {
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
         pSVar3->previewNode;
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)
     &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void ImplicitAnsiPortSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: header = child.node() ? &child.node()->as<PortHeaderSyntax>() : nullptr; return;
        case 2: declarator = child.node() ? &child.node()->as<DeclaratorSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}